

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
ExtractSubrangeInternal
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,uint start,uint num,long elements)

{
  LogMessage *pLVar1;
  string *psVar2;
  Type *pTVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  RepeatedPtrFieldBase *this_00;
  LogMessage local_90;
  ulong local_58;
  ulong local_50;
  long local_48;
  RepeatedPtrFieldBase *local_40;
  LogFinisher local_31;
  
  uVar4 = (ulong)num;
  uVar6 = (ulong)start;
  local_48 = elements;
  local_40 = &this->super_RepeatedPtrFieldBase;
  if ((int)start < 0) {
    internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/repeated_field.h"
               ,0x8aa);
    pLVar1 = internal::LogMessage::operator<<(&local_90,"CHECK failed: (start) >= (0): ");
    internal::LogFinisher::operator=(&local_31,pLVar1);
    internal::LogMessage::~LogMessage(&local_90);
  }
  this_00 = local_40;
  if ((int)num < 0) {
    internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/repeated_field.h"
               ,0x8ab);
    pLVar1 = internal::LogMessage::operator<<(&local_90,"CHECK failed: (num) >= (0): ");
    internal::LogFinisher::operator=(&local_31,pLVar1);
    this_00 = local_40;
    internal::LogMessage::~LogMessage(&local_90);
  }
  lVar5 = local_48;
  if (this_00->current_size_ < (int)(num + start)) {
    internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/repeated_field.h"
               ,0x8ac);
    pLVar1 = internal::LogMessage::operator<<(&local_90,"CHECK failed: (start + num) <= (size()): ")
    ;
    internal::LogFinisher::operator=(&local_31,pLVar1);
    lVar5 = local_48;
    internal::LogMessage::~LogMessage(&local_90);
    this_00 = local_40;
  }
  if (0 < (int)num) {
    local_58 = uVar4;
    local_50 = uVar6;
    if (lVar5 != 0) {
      if (this_00->arena_ == (Arena *)0x0) {
        uVar6 = 0;
        do {
          pTVar3 = internal::RepeatedPtrFieldBase::
                   Mutable<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (this_00,start + (int)uVar6);
          *(Type **)(lVar5 + uVar6 * 8) = pTVar3;
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
      }
      else {
        uVar6 = 0;
        do {
          internal::RepeatedPtrFieldBase::
          Mutable<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                    (this_00,start + (int)uVar6);
          psVar2 = (string *)operator_new(0x20);
          this_00 = local_40;
          *(string **)psVar2 = psVar2 + 0x10;
          *(undefined8 *)(psVar2 + 8) = 0;
          psVar2[0x10] = (string)0x0;
          std::__cxx11::string::_M_assign(psVar2);
          *(string **)(local_48 + uVar6 * 8) = psVar2;
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
      }
    }
    internal::RepeatedPtrFieldBase::CloseGap(this_00,(int)local_50,(int)local_58);
  }
  return;
}

Assistant:

inline void RepeatedPtrField<Element>::ExtractSubrangeInternal(
    int start, int num, Element** elements, std::true_type) {
  GOOGLE_DCHECK_GE(start, 0);
  GOOGLE_DCHECK_GE(num, 0);
  GOOGLE_DCHECK_LE(start + num, size());

  if (num > 0) {
    // Save the values of the removed elements if requested.
    if (elements != NULL) {
      if (GetArena() != NULL) {
        // If we're on an arena, we perform a copy for each element so that the
        // returned elements are heap-allocated.
        for (int i = 0; i < num; ++i) {
          Element* element =
              RepeatedPtrFieldBase::Mutable<TypeHandler>(i + start);
          typename TypeHandler::Type* new_value =
              TypeHandler::NewFromPrototype(element, NULL);
          TypeHandler::Merge(*element, new_value);
          elements[i] = new_value;
        }
      } else {
        for (int i = 0; i < num; ++i) {
          elements[i] = RepeatedPtrFieldBase::Mutable<TypeHandler>(i + start);
        }
      }
    }
    CloseGap(start, num);
  }
}